

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

void __thiscall
bitio::bitio_stream::bitio_stream
          (bitio_stream *this,string *filename,access_enum op,uint64_t buffer_size)

{
  char *pcVar1;
  FILE *pFVar2;
  uchar *puVar3;
  uint64_t buffer_size_local;
  access_enum op_local;
  string *filename_local;
  bitio_stream *this_local;
  
  std::__cxx11::string::string((string *)&this->filename);
  this->file = (FILE *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->filename,filename);
  if (op == READ) {
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (filename);
    pFVar2 = fopen(pcVar1,"rb");
    this->file = (FILE *)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      return;
    }
  }
  if (op == WRITE) {
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (filename);
    pFVar2 = fopen(pcVar1,"wb");
    this->file = (FILE *)pFVar2;
  }
  else if (op == APPEND) {
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (filename);
    pFVar2 = fopen(pcVar1,"a");
    this->file = (FILE *)pFVar2;
  }
  this->buffer_size = buffer_size;
  puVar3 = (uchar *)malloc(buffer_size);
  this->byte_buffer = puVar3;
  this->bit_count = '\0';
  this->eof = false;
  this->bit_buffer = '\0';
  this->current_buffer_length = 0;
  this->byte_index = 0;
  return;
}

Assistant:

bitio_stream::bitio_stream(std::string filename, access_enum op, uint64_t buffer_size) {
    file = nullptr;
    this->filename = filename;

    if ((op == READ) && !(file = fopen(filename.c_str(), "rb"))) {
        return;
    } else if (op == WRITE) {
        file = fopen(filename.c_str(), "wb");
    } else if (op == APPEND) {
        file = fopen(filename.c_str(), "a");
    }

    this->buffer_size = buffer_size;
    byte_buffer = (unsigned char *) malloc(sizeof(unsigned char) * buffer_size);
    bit_count = 0;
    eof = false;
    bit_buffer = 0;
    current_buffer_length = 0;
    byte_index = 0;

}